

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O3

Msg * __thiscall util::logging::Msg::operator+(Msg *__return_storage_ptr__,Msg *this,double val)

{
  double *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  double local_28;
  double val_local;
  
  local_28 = val;
  boost::lexical_cast<std::__cxx11::string,double>(&local_48,(boost *)&local_28,in_RDX);
  operator+(__return_storage_ptr__,this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Msg Msg::operator+( double val)
		{
			return operator+( boost::lexical_cast<std::string>(val) );
		}